

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * __thiscall
gulps::message::print_message_abi_cxx11_(string *__return_storage_ptr__,message *this,bool inc_text)

{
  tm *ptVar1;
  format_error *this_00;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  size_type local_2f8;
  size_type sStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined1 local_2c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2b0;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined1 *local_a8;
  code *local_a0;
  char *local_98;
  pointer local_88;
  size_type sStack_80;
  pointer local_78;
  size_type sStack_70;
  pointer local_68;
  size_type sStack_60;
  pointer local_58;
  size_type sStack_50;
  int64_t local_48;
  
  local_2c0._0_8_ = this->time;
  ptVar1 = localtime_r((time_t *)local_2c0,(tm *)(local_2c0 + 8));
  if (ptVar1 != (tm *)0x0) {
    local_2c8 = local_288;
    local_2d8 = local_298;
    uStack_2d0 = uStack_290;
    local_2e8 = aStack_2b0._8_8_;
    uStack_2e0 = uStack_2a0;
    local_2f8 = local_2c0._8_8_;
    sStack_2f0 = aStack_2b0._M_allocated_capacity;
    if ((ulong)this->lvl < 9) {
      local_98 = &DAT_00139614 + *(int *)(&DAT_00139614 + (ulong)this->lvl * 4);
    }
    else {
      local_98 = "UNKNOWN";
    }
    local_a0 = fmt::v5::internal::
               value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               ::format_custom_arg<tm>;
    local_88 = (this->thread_id)._M_dataplus._M_p;
    sStack_80 = (this->thread_id)._M_string_length;
    local_78 = (this->cat_major)._M_dataplus._M_p;
    sStack_70 = (this->cat_major)._M_string_length;
    local_68 = (this->cat_minor)._M_dataplus._M_p;
    sStack_60 = (this->cat_minor)._M_string_length;
    local_58 = (this->src_path)._M_dataplus._M_p;
    sStack_50 = (this->src_path)._M_string_length;
    local_48 = this->src_line;
    aStack_2b0._M_allocated_capacity = 0;
    local_2c0._0_8_ = &PTR_grow_00144ae0;
    aStack_2b0._8_8_ = 500;
    format_str.size_ = 0x29;
    format_str.data_ = "{:%Y-%m-%d %H:%M:%S} {} [{}] {}.{} {}:{} ";
    args.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_a8;
    args.types_ = fmt::v5::
                  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,tm,char_const*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,long>
                  ::TYPES;
    local_2c0._8_8_ = &uStack_2a0;
    local_a8 = (undefined1 *)&local_2f8;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)local_2c0,format_str,args);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_2c0._8_8_,
               aStack_2b0._M_allocated_capacity + local_2c0._8_8_);
    local_2c0._0_8_ = &PTR_grow_00144ae0;
    if ((undefined8 *)local_2c0._8_8_ != &uStack_2a0) {
      operator_delete((void *)local_2c0._8_8_);
    }
    if (inc_text) {
      print_text_abi_cxx11_((string *)local_2c0,this);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_2c0._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._0_8_ != &aStack_2b0) {
        operator_delete((void *)local_2c0._0_8_);
      }
    }
    return __return_storage_ptr__;
  }
  this_00 = (format_error *)__cxa_allocate_exception(0x10);
  fmt::v5::format_error::format_error(this_00,"time_t value out of range");
  __cxa_throw(this_00,&fmt::v5::format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string print_message(bool inc_text = true) const
		{
			std::string out = fmt::format("{:%Y-%m-%d %H:%M:%S} {} [{}] {}.{} {}:{} ", fmt::localtime(time), 
					level_to_str(lvl), thread_id, cat_major, cat_minor, src_path, src_line);

			if(inc_text)
				out += print_text();

			return out;
		}